

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtcore.cpp
# Opt level: O1

char * rtcGetDeviceLastErrorMessage(RTCDevice hdevice)

{
  char *pcVar1;
  
  if (hdevice == (RTCDevice)0x0) {
    pcVar1 = embree::Device::getThreadLastErrorMessage();
  }
  else {
    pcVar1 = embree::Device::getDeviceLastErrorMessage((Device *)hdevice);
  }
  return pcVar1;
}

Assistant:

RTC_API const char* rtcGetDeviceLastErrorMessage(RTCDevice hdevice)
  {
    Device* device = (Device*) hdevice;
    RTC_CATCH_BEGIN;
    RTC_TRACE(rtcGetDeviceLastErrorMessage);
    if (device == nullptr) return Device::getThreadLastErrorMessage();
    else                   return device->getDeviceLastErrorMessage();
    RTC_CATCH_END(device);
    return "";
  }